

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollback_on_exception.hpp
# Opt level: O3

void __thiscall
so_5::details::rollback_on_exception_details::
rollbacker_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/layer_core.cpp:127:4)>
::~rollbacker_t(rollbacker_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_layer_core_cpp:127:4)>
                *this)

{
  anon_class_16_2_e88080a6 *paVar1;
  iterator *piVar2;
  byte in_SIL;
  iterator *piVar3;
  
  if ((in_SIL & 1) == 0) {
    paVar1 = this->m_action;
    piVar3 = paVar1->it;
    piVar2 = (iterator *)**(long **)&this->m_commited;
    if (piVar3 != piVar2) {
      do {
        (**(code **)(((piVar3[1]._M_current)->m_true_type)._M_target + 0x18))();
        piVar3 = piVar3 + 3;
      } while (piVar3 != piVar2);
      piVar2 = (iterator *)**(long **)&this->m_commited;
      for (piVar3 = paVar1->it; piVar3 != piVar2; piVar3 = piVar3 + 3) {
        (**(code **)(((piVar3[1]._M_current)->m_true_type)._M_target + 0x20))();
      }
    }
  }
  return;
}

Assistant:

inline ~rollbacker_t() { if( !m_commited ) m_action(); }